

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::Base64EscapeInternal
               (uchar *src,int szsrc,string *dest,bool do_padding,char *base64_chars)

{
  int iVar1;
  int iVar2;
  LogMessage *other;
  pointer dest_00;
  LogFinisher local_69;
  LogMessage local_68;
  
  iVar1 = CalculateBase64EscapedLen(szsrc,do_padding);
  std::__cxx11::string::resize((ulong)dest);
  if (dest->_M_string_length == 0) {
    dest_00 = (char *)0x0;
  }
  else {
    dest_00 = (dest->_M_dataplus)._M_p;
  }
  iVar2 = Base64EscapeInternal
                    (src,szsrc,dest_00,(int)dest->_M_string_length,base64_chars,do_padding);
  if (iVar1 != iVar2) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x8a7);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (calc_escaped_size) == (escaped_len): ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  std::__cxx11::string::erase((ulong)dest,(long)iVar2);
  return;
}

Assistant:

void Base64EscapeInternal(const unsigned char *src, int szsrc,
                          std::string *dest, bool do_padding,
                          const char *base64_chars) {
  const int calc_escaped_size =
    CalculateBase64EscapedLen(szsrc, do_padding);
  dest->resize(calc_escaped_size);
  const int escaped_len = Base64EscapeInternal(src, szsrc,
                                               string_as_array(dest),
                                               dest->size(),
                                               base64_chars,
                                               do_padding);
  GOOGLE_DCHECK_EQ(calc_escaped_size, escaped_len);
  dest->erase(escaped_len);
}